

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> * __thiscall
helics::CommonCore::getLocalEndpoint(CommonCore *this,string_view name)

{
  BasicHandleInfo *pBVar1;
  shared_mutex *__rwlock;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  pBVar1 = HandleManager::getInterfaceHandle(&(this->handles).m_obj,name,ENDPOINT);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)pBVar1;
}

Assistant:

const BasicHandleInfo* CommonCore::getLocalEndpoint(std::string_view name) const
{
    return handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::ENDPOINT); });
}